

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_prepared.cpp
# Opt level: O2

void RecreateTable(Connection *con)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  StreamEndStop local_101;
  long *local_100;
  ReusableStringStream local_f8;
  Connection *local_d8;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  prepare;
  string local_c8;
  SourceLineInfo local_a8 [2];
  StringRef local_88;
  AssertionHandler catchAssertionHandler;
  
  lVar2 = 1000;
  local_d8 = con;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::__cxx11::string::string
              ((string *)&catchAssertionHandler,"create or replace table foo as select * from foo",
               (allocator *)&local_c8);
    duckdb::Connection::Prepare((string *)&prepare);
    std::__cxx11::string::~string((string *)&catchAssertionHandler);
    duckdb::
    unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
    operator->(&prepare);
    duckdb::PreparedStatement::Execute<>((PreparedStatement *)&local_100);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_100);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      local_c8._M_dataplus._M_p = "FAIL";
      local_c8._M_string_length = 4;
      local_a8[0].file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_prepared.cpp"
      ;
      local_a8[0].line = 0x18;
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_c8,local_a8,(StringRef)ZEXT816(0x484131)
                 ,Normal);
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_f8.m_index = 0;
      local_f8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_f8);
      Catch::StreamEndStop::operator+[abi_cxx11_(&local_101);
      std::operator<<(local_f8.m_oss,(string *)local_a8);
      Catch::ReusableStringStream::str_abi_cxx11_(&local_c8,&local_f8);
      local_88.m_start = local_c8._M_dataplus._M_p;
      local_88.m_size = local_c8._M_string_length;
      Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_88);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)local_a8);
      Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    if (local_100 != (long *)0x0) {
      (**(code **)(*local_100 + 8))();
    }
    std::unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>::
    ~unique_ptr((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                 *)&prepare);
  }
  return;
}

Assistant:

static void RecreateTable(Connection con) {
	for (idx_t i = 0; i < 1000; i++) {
		auto prepare = con.Prepare("create or replace table foo as select * from foo");
		auto result = prepare->Execute();
		if (result->HasError()) {
			FAIL();
		}
	}
}